

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scratch_impl.h
# Opt level: O2

int secp256k1_scratch_allocate_frame(secp256k1_scratch *scratch,size_t n,size_t objects)

{
  size_t sVar1;
  void *pvVar2;
  int iVar3;
  size_t size;
  
  sVar1 = secp256k1_scratch_max_allocation(scratch,objects);
  iVar3 = 0;
  if (n <= sVar1) {
    size = objects * 0x10 + n;
    pvVar2 = checked_malloc(scratch->error_callback,size);
    sVar1 = scratch->frame;
    scratch->data[sVar1] = pvVar2;
    if (pvVar2 != (void *)0x0) {
      scratch->frame_size[sVar1] = size;
      scratch->offset[scratch->frame] = 0;
      scratch->frame = scratch->frame + 1;
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

static int secp256k1_scratch_allocate_frame(secp256k1_scratch* scratch, size_t n, size_t objects) {
    VERIFY_CHECK(scratch->frame < SECP256K1_SCRATCH_MAX_FRAMES);

    if (n <= secp256k1_scratch_max_allocation(scratch, objects)) {
        n += objects * ALIGNMENT;
        scratch->data[scratch->frame] = checked_malloc(scratch->error_callback, n);
        if (scratch->data[scratch->frame] == NULL) {
            return 0;
        }
        scratch->frame_size[scratch->frame] = n;
        scratch->offset[scratch->frame] = 0;
        scratch->frame++;
        return 1;
    } else {
        return 0;
    }
}